

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

count * __thiscall
lest::for_test<lest::count>(lest *this,tests *specification,texts *in,count *perform,int n)

{
  pointer *ppbVar1;
  int iVar2;
  int iVar3;
  fd_set *__exceptfds;
  int iVar4;
  fd_set *__writefds;
  test *ptVar5;
  undefined4 in_register_00000084;
  string local_78 [32];
  test local_58;
  
  iVar3 = (int)perform;
  iVar4 = 0;
  while( true ) {
    __exceptfds = (fd_set *)
                  (ulong)CONCAT31((int3)((ulong)perform >> 8),iVar4 < iVar3 || iVar3 == -1);
    if (iVar4 >= iVar3 && iVar3 != -1) break;
    for (ptVar5 = *(test **)this; ptVar5 != *(test **)(this + 8); ptVar5 = ptVar5 + 1) {
      std::__cxx11::string::string(local_78,(string *)ptVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffff70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)specification);
      iVar2 = select((int)local_78,(fd_set *)&stack0xffffffffffffff70,__writefds,__exceptfds,
                     (timeval *)CONCAT44(in_register_00000084,n));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff70);
      std::__cxx11::string::_M_dispose();
      if ((char)iVar2 != '\0') {
        test::test(&local_58,ptVar5);
        ppbVar1 = &(in->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppbVar1 = *(int *)ppbVar1 + 1;
        std::__cxx11::string::_M_dispose();
      }
    }
    iVar4 = iVar4 + 1;
  }
  return (count *)in;
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}